

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void expandFormatArguments<Token>(vector<String,_std::allocator<String>_> *data,Token *arg)

{
  value_type local_30;
  
  FormatArgument::FormatArgument<Token>((FormatArgument *)&local_30,arg);
  std::vector<String,_std::allocator<String>_>::push_back(data,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void expandFormatArguments (std::vector<String>& data, const T& arg, const RestTypes& ... rest)
{
	data.push_back (FormatArgument (arg).text());
	expandFormatArguments (data, rest...);
}